

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_mem_stream.cpp
# Opt level: O1

ssize_t __thiscall
dpfb::streams::ConstMemStream::read(ConstMemStream *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  void *pvVar2;
  undefined4 in_register_00000034;
  
  if (__buf != (void *)0x0 && (void *)CONCAT44(in_register_00000034,__fd) != (void *)0x0) {
    uVar1 = this->pos;
    pvVar2 = (void *)(this->dataSize - uVar1);
    if (uVar1 <= this->dataSize && pvVar2 != (void *)0x0) {
      if (pvVar2 < __buf) {
        __buf = pvVar2;
      }
      memcpy((void *)CONCAT44(in_register_00000034,__fd),this->data + uVar1,(size_t)__buf);
      this->pos = this->pos + (long)__buf;
      return (ssize_t)__buf;
    }
  }
  return 0;
}

Assistant:

std::size_t ConstMemStream::read(void* dst, std::size_t dstSize) noexcept
{
    if (!dst || dstSize == 0 || pos >= dataSize)
        return 0;

    std::size_t maxRead = dataSize - pos;
    if (dstSize > maxRead)
        dstSize = maxRead;

    std::memcpy(dst, data + pos, dstSize);
    pos += dstSize;

    return dstSize;
}